

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_impl.h
# Opt level: O3

void secp256k1_fe_mul_int_unchecked(secp256k1_fe *r,int a)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  secp256k1_ge *psVar7;
  secp256k1_ge *a_00;
  secp256k1_ge *a_01;
  secp256k1_ge *psVar8;
  secp256k1_fe *a_02;
  secp256k1_fe *a_03;
  secp256k1_ge *psVar9;
  secp256k1_ge *psVar10;
  secp256k1_ge *a_04;
  undefined1 auVar11 [16];
  undefined1 auStack_108 [104];
  secp256k1_ge *psStack_a0;
  secp256k1_ge_storage sStack_90;
  secp256k1_fe *psStack_50;
  secp256k1_ge *psStack_48;
  uint uVar12;
  
  uVar2 = (ulong)(uint)a;
  a_02 = r;
  secp256k1_fe_verify(r);
  iVar1 = r->magnitude * a;
  if (iVar1 < 0x21) {
    r->n[0] = r->n[0] * uVar2;
    r->n[1] = r->n[1] * uVar2;
    r->n[2] = r->n[2] * uVar2;
    r->n[3] = r->n[3] * uVar2;
    r->n[4] = uVar2 * r->n[4];
    r->magnitude = iVar1;
    r->normalized = 0;
    secp256k1_fe_verify(r);
    return;
  }
  secp256k1_fe_mul_int_unchecked_cold_1();
  secp256k1_fe_verify(a_02);
  a_03 = (secp256k1_fe *)(ulong)(uint)a_02->magnitude;
  secp256k1_fe_verify_magnitude(a_03,0x1f);
  psVar7 = (secp256k1_ge *)a_02->n[0];
  uVar2 = -(ulong)((uint)psVar7 & 1);
  uVar4 = uVar2 >> 0xc;
  uVar6 = (long)(psVar7->x).n + (uVar4 & 0xffffefffffc2f);
  if ((uVar6 & 1) == 0) {
    uVar3 = (uVar2 >> 0x10) + a_02->n[4];
    uVar5 = uVar4 + a_02->n[3];
    uVar12 = (uint)(uVar2 >> 0x2c);
    auVar11._0_8_ = CONCAT44(uVar12,(int)uVar4);
    auVar11._8_4_ = (int)uVar4;
    auVar11._12_4_ = uVar12;
    uVar2 = auVar11._0_8_ + a_02->n[1];
    uVar4 = auVar11._8_8_ + a_02->n[2];
    a_02->n[0] = ((ulong)((uint)uVar2 & 1) << 0x33) + (uVar6 >> 1);
    a_02->n[1] = ((uVar4 & 1) << 0x33) + (uVar2 >> 1);
    a_02->n[2] = ((uVar5 & 1) << 0x33) + (uVar4 >> 1);
    a_02->n[3] = ((ulong)((uint)uVar3 & 1) << 0x33) + (uVar5 >> 1);
    a_02->n[4] = uVar3 >> 1;
    a_02->magnitude = (a_02->magnitude >> 1) + 1;
    a_02->normalized = 0;
    secp256k1_fe_verify(a_02);
    return;
  }
  secp256k1_fe_half_cold_1();
  a_00 = psVar7;
  secp256k1_fe_verify(a_03);
  psVar9 = psVar7;
  secp256k1_fe_verify(&psVar7->x);
  iVar1 = (psVar7->x).magnitude + a_03->magnitude;
  if (iVar1 < 0x21) {
    a_03->n[0] = a_03->n[0] + (psVar7->x).n[0];
    a_03->n[1] = a_03->n[1] + (psVar7->x).n[1];
    a_03->n[2] = a_03->n[2] + (psVar7->x).n[2];
    a_03->n[3] = a_03->n[3] + (psVar7->x).n[3];
    a_03->n[4] = a_03->n[4] + (psVar7->x).n[4];
    a_03->magnitude = iVar1;
    a_03->normalized = 0;
    secp256k1_fe_verify(a_03);
    return;
  }
  secp256k1_fe_add_cold_1();
  a_01 = a_00;
  psVar10 = a_00;
  psStack_50 = a_03;
  psStack_48 = psVar7;
  secp256k1_ge_verify(a_00);
  if (a_00->infinity == 0) {
    secp256k1_ge_to_storage(&sStack_90,a_00);
    (psVar9->y).n[0] = sStack_90.y.n[2];
    (psVar9->y).n[1] = sStack_90.y.n[3];
    (psVar9->x).n[4] = sStack_90.y.n[0];
    (psVar9->x).magnitude = (undefined4)sStack_90.y.n[1];
    (psVar9->x).normalized = sStack_90.y.n[1]._4_4_;
    (psVar9->x).n[2] = sStack_90.x.n[2];
    (psVar9->x).n[3] = sStack_90.x.n[3];
    (psVar9->x).n[0] = sStack_90.x.n[0];
    (psVar9->x).n[1] = sStack_90.x.n[1];
    return;
  }
  secp256k1_ge_to_bytes_cold_1();
  a_04 = (secp256k1_ge *)auStack_108;
  psVar8 = a_01;
  psVar7 = a_01;
  auStack_108._96_8_ = psVar9;
  psStack_a0 = a_00;
  secp256k1_ge_verify(a_01);
  if (a_01->infinity == 0) {
    auStack_108._48_8_ = (a_01->x).n[0];
    auStack_108._56_8_ = (a_01->x).n[1];
    auStack_108._64_8_ = (a_01->x).n[2];
    auStack_108._72_8_ = (a_01->x).n[3];
    auStack_108._80_8_ = (a_01->x).n[4];
    auStack_108._88_4_ = (a_01->x).magnitude;
    auStack_108._92_4_ = (a_01->x).normalized;
    psVar7 = (secp256k1_ge *)(auStack_108 + 0x30);
    secp256k1_fe_normalize((secp256k1_fe *)psVar7);
    auStack_108._0_8_ = (a_01->y).n[0];
    auStack_108._8_8_ = (a_01->y).n[1];
    auStack_108._16_8_ = (a_01->y).n[2];
    auStack_108._24_8_ = (a_01->y).n[3];
    auStack_108._32_8_ = (a_01->y).n[4];
    auStack_108._40_4_ = (a_01->y).magnitude;
    auStack_108._44_4_ = (a_01->y).normalized;
    secp256k1_fe_normalize((secp256k1_fe *)auStack_108);
    secp256k1_fe_verify((secp256k1_fe *)psVar7);
    if (auStack_108._92_4_ != 0) {
      (psVar10->x).n[0] = auStack_108._56_8_ << 0x34 | auStack_108._48_8_;
      (psVar10->x).n[1] = auStack_108._64_8_ << 0x28 | (ulong)auStack_108._56_8_ >> 0xc;
      (psVar10->x).n[2] = auStack_108._72_8_ << 0x1c | (ulong)auStack_108._64_8_ >> 0x18;
      (psVar10->x).n[3] = auStack_108._80_8_ << 0x10 | (ulong)auStack_108._72_8_ >> 0x24;
      secp256k1_fe_verify((secp256k1_fe *)auStack_108);
      if (auStack_108._44_4_ != 0) {
        (psVar10->x).n[4] = auStack_108._8_8_ << 0x34 | auStack_108._0_8_;
        uVar2 = auStack_108._16_8_ << 0x28 | (ulong)auStack_108._8_8_ >> 0xc;
        (psVar10->x).magnitude = (int)uVar2;
        (psVar10->x).normalized = (int)(uVar2 >> 0x20);
        (psVar10->y).n[0] = auStack_108._24_8_ << 0x1c | (ulong)auStack_108._16_8_ >> 0x18;
        (psVar10->y).n[1] = auStack_108._32_8_ << 0x10 | (ulong)auStack_108._24_8_ >> 0x24;
        return;
      }
      goto LAB_0011a170;
    }
  }
  else {
    secp256k1_ge_to_storage_cold_1();
  }
  a_04 = psVar7;
  secp256k1_ge_to_storage_cold_3();
LAB_0011a170:
  secp256k1_ge_to_storage_cold_2();
  (a_04->x).n[0] = (psVar8->x).n[0] & 0xfffffffffffff;
  (a_04->x).n[1] = ((psVar8->x).n[1] & 0xffffffffff) << 0xc | (psVar8->x).n[0] >> 0x34;
  (a_04->x).n[2] = ((psVar8->x).n[2] & 0xfffffff) << 0x18 | (psVar8->x).n[1] >> 0x28;
  (a_04->x).n[3] = ((psVar8->x).n[3] & 0xffff) << 0x24 | (psVar8->x).n[2] >> 0x1c;
  (a_04->x).n[4] = (psVar8->x).n[3] >> 0x10;
  (a_04->x).magnitude = 1;
  (a_04->x).normalized = 1;
  secp256k1_fe_verify(&a_04->x);
  (a_04->y).n[0] = (psVar8->x).n[4] & 0xfffffffffffff;
  uVar2._0_4_ = (psVar8->x).magnitude;
  uVar2._4_4_ = (psVar8->x).normalized;
  (a_04->y).n[1] = (uVar2 & 0xffffffffff) << 0xc | (psVar8->x).n[4] >> 0x34;
  uVar4._0_4_ = (psVar8->x).magnitude;
  uVar4._4_4_ = (psVar8->x).normalized;
  (a_04->y).n[2] = ((psVar8->y).n[0] & 0xfffffff) << 0x18 | uVar4 >> 0x28;
  (a_04->y).n[3] = ((psVar8->y).n[1] & 0xffff) << 0x24 | (psVar8->y).n[0] >> 0x1c;
  (a_04->y).n[4] = (psVar8->y).n[1] >> 0x10;
  (a_04->y).magnitude = 1;
  (a_04->y).normalized = 1;
  secp256k1_fe_verify(&a_04->y);
  a_04->infinity = 0;
  secp256k1_ge_verify(a_04);
  return;
}

Assistant:

SECP256K1_INLINE static void secp256k1_fe_mul_int_unchecked(secp256k1_fe *r, int a) {
    SECP256K1_FE_VERIFY(r);

    VERIFY_CHECK(a >= 0 && a <= 32);
    VERIFY_CHECK(a*r->magnitude <= 32);
    secp256k1_fe_impl_mul_int_unchecked(r, a);
    r->magnitude *= a;
    r->normalized = 0;

    SECP256K1_FE_VERIFY(r);
}